

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_files.h
# Opt level: O3

int cf_dir_open(cf_dir_t *dir,char *path)

{
  DIR *__dirp;
  dirent *pdVar1;
  int *piVar2;
  char *pcVar3;
  int in_R9D;
  
  cf_safe_strcpy_internal(dir->path,path,0,0x400,(char *)0x1a4,in_R9D);
  __dirp = opendir(path);
  dir->dir = (DIR *)__dirp;
  if (__dirp != (DIR *)0x0) {
    dir->has_next = 1;
    pdVar1 = readdir(__dirp);
    dir->entry = (dirent *)pdVar1;
    if (dir->dir == (DIR *)0x0) {
      dir->has_next = 0;
    }
    return 1;
  }
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  printf("ERROR: Failed to open directory (%s): %s.\n",path,pcVar3);
  cf_dir_close(dir);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
                ,0x1ab,"int cf_dir_open(cf_dir_t *, const char *)");
}

Assistant:

int cf_dir_open(cf_dir_t* dir, const char* path)
	{
		cf_safe_strcpy(dir->path, path, 0, CUTE_FILES_MAX_PATH);
		dir->dir = opendir(path);

		if (!dir->dir)
		{
			printf("ERROR: Failed to open directory (%s): %s.\n", path, strerror(errno));
			cf_dir_close(dir);
			CUTE_FILES_ASSERT(0);
			return 0;
		}

		dir->has_next = 1;
		dir->entry = readdir(dir->dir);
		if (!dir->dir) dir->has_next = 0;

		return 1;
	}